

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

CURLcode cf_he_query(Curl_cfilter *cf,Curl_easy *data,int query,int *pres1,void *pres2)

{
  void *pvVar1;
  long lVar2;
  long *plVar3;
  Curl_cfilter *pCVar4;
  int iVar5;
  CURLcode CVar6;
  long in_RAX;
  uint uVar7;
  uint uVar8;
  long lVar9;
  bool bVar10;
  curltime cVar11;
  long lStack_38;
  int breply_ms;
  
  if ((cf->field_0x24 & 1) == 0) {
    if (query == 5) {
      iVar5 = 5;
    }
    else {
      if (query != 4) {
        if (query == 2) {
          pvVar1 = cf->ctx;
          uVar8 = 0xffffffff;
          lStack_38 = in_RAX;
          for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
            lVar2 = *(long *)((long)pvVar1 + lVar9 * 8 + 0x20);
            if ((lVar2 != 0) && (plVar3 = *(long **)(lVar2 + 0x28), plVar3 != (long *)0x0)) {
              iVar5 = (**(code **)(*plVar3 + 0x68))(plVar3,data,2,&breply_ms,0);
              if (-1 < lStack_38 && iVar5 == 0) {
                uVar7 = uVar8;
                if (breply_ms < (int)uVar8) {
                  uVar7 = breply_ms;
                }
                bVar10 = (int)uVar8 < 0;
                uVar8 = uVar7;
                if (bVar10) {
                  uVar8 = breply_ms;
                }
              }
            }
          }
          *pres1 = uVar8;
          if (data == (Curl_easy *)0x0) {
            return CURLE_OK;
          }
          if (cf == (Curl_cfilter *)0x0) {
            return CURLE_OK;
          }
          if ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) == 0) {
            return CURLE_OK;
          }
          if (cf->cft->log_level < 1) {
            return CURLE_OK;
          }
          Curl_trc_cf_infof(data,cf,"query connect reply: %dms",(ulong)uVar8);
          return CURLE_OK;
        }
        goto LAB_004f1e83;
      }
      iVar5 = 4;
    }
    cVar11 = get_max_baller_time(cf,data,iVar5);
    *(time_t *)pres2 = cVar11.tv_sec;
    *(int *)((long)pres2 + 8) = cVar11.tv_usec;
    CVar6 = CURLE_OK;
  }
  else {
LAB_004f1e83:
    pCVar4 = cf->next;
    if (pCVar4 != (Curl_cfilter *)0x0) {
      CVar6 = (*pCVar4->cft->query)(pCVar4,data,query,pres1,pres2);
      return CVar6;
    }
    CVar6 = CURLE_UNKNOWN_OPTION;
  }
  return CVar6;
}

Assistant:

static CURLcode cf_he_query(struct Curl_cfilter *cf,
                            struct Curl_easy *data,
                            int query, int *pres1, void *pres2)
{
  struct cf_he_ctx *ctx = cf->ctx;

  if(!cf->connected) {
    switch(query) {
    case CF_QUERY_CONNECT_REPLY_MS: {
      int reply_ms = -1;
      size_t i;

      for(i = 0; i < ARRAYSIZE(ctx->baller); i++) {
        struct eyeballer *baller = ctx->baller[i];
        int breply_ms;

        if(baller && baller->cf &&
           !baller->cf->cft->query(baller->cf, data, query,
                                   &breply_ms, NULL)) {
          if(breply_ms >= 0 && (reply_ms < 0 || breply_ms < reply_ms))
            reply_ms = breply_ms;
        }
      }
      *pres1 = reply_ms;
      CURL_TRC_CF(data, cf, "query connect reply: %dms", *pres1);
      return CURLE_OK;
    }
    case CF_QUERY_TIMER_CONNECT: {
      struct curltime *when = pres2;
      *when = get_max_baller_time(cf, data, CF_QUERY_TIMER_CONNECT);
      return CURLE_OK;
    }
    case CF_QUERY_TIMER_APPCONNECT: {
      struct curltime *when = pres2;
      *when = get_max_baller_time(cf, data, CF_QUERY_TIMER_APPCONNECT);
      return CURLE_OK;
    }
    default:
      break;
    }
  }

  return cf->next?
    cf->next->cft->query(cf->next, data, query, pres1, pres2) :
    CURLE_UNKNOWN_OPTION;
}